

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O3

void testing_run_(testing_base tb,_func_void_testing *f,char *name,int is_benchmark)

{
  nsync_mu *mu;
  int iVar1;
  _func_void_void_ptr *container;
  FILE *pFVar2;
  nsync_dll_list_ pnVar3;
  closure *cl;
  code *pcVar4;
  
  mu = &tb->testing_mu;
  nsync::nsync_mu_lock(mu);
  iVar1 = tb->exit_status;
  nsync::nsync_mu_unlock(mu);
  if (1 < iVar1) {
    return;
  }
  if (is_benchmark == 0) {
    iVar1 = tb->run_tests;
  }
  else {
    iVar1 = tb->run_benchmarks;
  }
  if (iVar1 == 0) {
    return;
  }
  if ((tb->include_pat != (char *)0x0) && (iVar1 = match(tb->include_pat,name), iVar1 == 0)) {
    return;
  }
  if ((tb->exclude_pat != (char *)0x0) && (iVar1 = match(tb->exclude_pat,name), iVar1 != 0)) {
    return;
  }
  container = (_func_void_void_ptr *)calloc(1,0x68);
  nsync::nsync_dll_init_((nsync_dll_element_ *)(container + 0x50),container);
  *(testing_base *)container = tb;
  *(_func_void_testing **)(container + 0x40) = f;
  *(char **)(container + 0x48) = name;
  if (tb->parallelism == 1) {
    pFVar2 = (FILE *)tb->fp;
  }
  else {
    pFVar2 = tmpfile();
  }
  *(FILE **)(container + 0x18) = pFVar2;
  if (is_benchmark == 0) {
    if (tb->benchmarks_running == 0) {
      pcVar4 = run_test;
      goto LAB_0010655c;
    }
    nsync::nsync_mu_lock(mu);
    iVar1 = 0;
    nsync::nsync_mu_wait(mu,int_is_zero,&tb->child_count,(_func_int_void_ptr_void_ptr *)0x0);
    nsync::nsync_mu_unlock(mu);
    pcVar4 = run_test;
  }
  else {
    if (tb->benchmarks_running != 0) {
      pcVar4 = run_benchmark;
      goto LAB_0010655c;
    }
    nsync::nsync_mu_lock(mu);
    nsync::nsync_mu_wait(mu,int_is_zero,&tb->child_count,(_func_int_void_ptr_void_ptr *)0x0);
    nsync::nsync_mu_unlock(mu);
    pcVar4 = run_benchmark;
    iVar1 = 1;
    if (tb->suppress_header == 0) {
      output_header(tb->fp,tb->prog);
    }
  }
  tb->benchmarks_running = iVar1;
LAB_0010655c:
  nsync::nsync_mu_lock(mu);
  nsync::nsync_mu_wait(mu,spare_thread,tb,(_func_int_void_ptr_void_ptr *)0x0);
  tb->child_count = tb->child_count + 1;
  pnVar3 = nsync::nsync_dll_make_last_in_list_
                     (tb->children,(nsync_dll_element_ *)(container + 0x50));
  tb->children = pnVar3;
  nsync::nsync_mu_unlock(mu);
  cl = (closure *)malloc(0x18);
  cl->f0 = closure_f0_testing;
  cl[1].f0 = pcVar4;
  cl[2].f0 = container;
  closure_fork(cl);
  return;
}

Assistant:

void testing_run_ (testing_base tb, void (*f) (testing t), const char *name, int is_benchmark) {
	int exit_status;
	nsync_mu_lock (&tb->testing_mu);
	exit_status = tb->exit_status;
	nsync_mu_unlock (&tb->testing_mu);
	if (exit_status < 2 &&
	    (!is_benchmark || tb->run_benchmarks) &&
	    (is_benchmark || tb->run_tests) &&
	    (tb->include_pat == NULL || match (tb->include_pat, name)) &&
	    (tb->exclude_pat == NULL || !match (tb->exclude_pat, name))) {
		testing t = (testing) malloc (sizeof (*t));
		memset ((void *) t, 0, sizeof (*t));
		nsync_dll_init_ (&t->siblings, t);
		t->base = tb;
		t->f = f;
		t->name = name;
		if (tb->parallelism == 1) {
			t->fp = tb->fp;
		} else {
			t->fp = tmpfile ();
		}
		if (!is_benchmark) {
			if (tb->benchmarks_running) {
				nsync_mu_lock (&tb->testing_mu);
				nsync_mu_wait (&tb->testing_mu, &int_is_zero, &tb->child_count, NULL);
				nsync_mu_unlock (&tb->testing_mu);
				tb->benchmarks_running = 0;
			}
			nsync_mu_lock (&tb->testing_mu);
			nsync_mu_wait (&tb->testing_mu, &spare_thread, tb, NULL);
			tb->child_count++;
			tb->children = nsync_dll_make_last_in_list_ (tb->children, &t->siblings);
			nsync_mu_unlock (&tb->testing_mu);
			closure_fork (closure_testing (&run_test, t));
		} else {
			if (!tb->benchmarks_running) {
				nsync_mu_lock (&tb->testing_mu);
				nsync_mu_wait (&tb->testing_mu, &int_is_zero, &tb->child_count, NULL);
				nsync_mu_unlock (&tb->testing_mu);
				if (!tb->suppress_header) {
					output_header (tb->fp, tb->prog);
				}
				tb->benchmarks_running = 1;
			}
			nsync_mu_lock (&tb->testing_mu);
			nsync_mu_wait (&tb->testing_mu, &spare_thread, tb, NULL);
			tb->child_count++;
			tb->children = nsync_dll_make_last_in_list_ (tb->children, &t->siblings);
			nsync_mu_unlock (&tb->testing_mu);
			closure_fork (closure_testing (&run_benchmark, t));
		}
	}
}